

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_14::BinaryReaderObjdump::HandleInitExpr(BinaryReaderObjdump *this,InitExpr *expr)

{
  undefined4 uVar1;
  InitExpr *expr_local;
  BinaryReaderObjdump *this_local;
  
  if ((this->in_data_section_ & 1U) == 0) {
    if ((this->in_elem_section_ & 1U) == 0) {
      PrintInitExpr(this,expr);
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
    else {
      uVar1 = *(undefined4 *)&expr->field_0x4;
      (this->elem_init_expr_).type = expr->type;
      *(undefined4 *)&(this->elem_init_expr_).field_0x4 = uVar1;
      (this->elem_init_expr_).value.i64 = (expr->value).i64;
      *(undefined8 *)((long)&(this->elem_init_expr_).value + 8) =
           *(undefined8 *)((long)&expr->value + 8);
      this_local._4_4_ = InitExprToConstOffset(expr,&this->elem_offset_);
    }
  }
  else {
    uVar1 = *(undefined4 *)&expr->field_0x4;
    (this->data_init_expr_).type = expr->type;
    *(undefined4 *)&(this->data_init_expr_).field_0x4 = uVar1;
    (this->data_init_expr_).value.i64 = (expr->value).i64;
    *(undefined8 *)((long)&(this->data_init_expr_).value + 8) =
         *(undefined8 *)((long)&expr->value + 8);
    this_local._4_4_ = InitExprToConstOffset(expr,&this->data_offset_);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderObjdump::HandleInitExpr(const InitExpr& expr) {
  if (in_data_section_) {
    data_init_expr_ = expr;
    return InitExprToConstOffset(expr, &data_offset_);
  } else if (in_elem_section_) {
    elem_init_expr_ = expr;
    return InitExprToConstOffset(expr, &elem_offset_);
  } else {
    PrintInitExpr(expr);
  }
  return Result::Ok;
}